

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall Args::BaseException::~BaseException(BaseException *this)

{
  logic_error *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__BaseException_00162d50;
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  std::logic_error::~logic_error(in_RDI);
  return;
}

Assistant:

virtual ~BaseException() noexcept
	{
	}